

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O2

bool __thiscall
floorplan::GraphStatistics::isStringPairEqual
          (GraphStatistics *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *p1,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *p2)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((string *)p1);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((string *)&p1->second);
    if (iVar2 != 0) goto LAB_0015d4b0;
LAB_0015d4d7:
    bVar1 = true;
  }
  else {
LAB_0015d4b0:
    iVar2 = std::__cxx11::string::compare((string *)p1);
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare((string *)&p1->second);
      if (iVar2 == 0) goto LAB_0015d4d7;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GraphStatistics::isStringPairEqual(std::pair<std::string, std::string> p1, std::pair<std::string, std::string> p2){
  // cout << "Comparing " << p1.first <<" " << p1.second << " and " << p2.first << " " << p2.second << endl;
    if ( (p1.first.compare(p2.first) == 0 && p1.second.compare(p2.second) == 0) ||
         (p1.first.compare(p2.second) == 0 && p1.second.compare(p2.first) == 0) ){
    //    cout << "same!" << endl;
        return true;

    }
    else{
        return false;

    }
}